

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny-format.hh
# Opt level: O0

string * __thiscall
tinyusdz::fmt::format<unsigned_long,unsigned_long,std::__cxx11::string>
          (string *__return_storage_ptr__,fmt *this,string *in,unsigned_long *args,
          unsigned_long *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  bool bVar1;
  error_type *__rhs;
  value_type *sv;
  ostringstream local_218 [8];
  ostringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  unsigned_long *args_local_1;
  unsigned_long *args_local;
  string *in_local;
  
  ret.contained.
  super_storage_t_impl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = args_1;
  detail::tokenize((expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_58,(string *)this);
  bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_58);
  if (bVar1) {
    ::std::__cxx11::ostringstream::ostringstream(local_218);
    sv = nonstd::expected_lite::
         expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*((expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_58);
    detail::format_sv<unsigned_long,unsigned_long,std::__cxx11::string>
              ((ostringstream *)local_218,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)sv,(unsigned_long *)in,args,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ret.contained.
               super_storage_t_impl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._32_8_);
    ::std::__cxx11::ostringstream::str();
    ::std::__cxx11::ostringstream::~ostringstream(local_218);
  }
  else {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                     (char *)this);
    __rhs = nonstd::expected_lite::
            expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::error((expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_58);
    ::std::operator+(&local_78,&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    ::std::operator+(__return_storage_ptr__,&local_78,")");
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_98);
  }
  nonstd::expected_lite::
  expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~expected((expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const std::string &in, Args const &...args) {
  auto ret = detail::tokenize(in);
  if (!ret) {
    return in + "(format error: " + ret.error() + ")";
  }

  std::ostringstream ss;
  detail::format_sv(ss, (*ret), args...);

  return ss.str();
}